

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testFloatProperty_Test::TestBody(MaterialSystemTest_testFloatProperty_Test *this)

{
  float *pInput;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70;
  float local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  aiReturn local_30 [2];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  float pf;
  MaterialSystemTest_testFloatProperty_Test *this_local;
  
  gtest_ar.message_.ptr_._4_4_ = 0x4812de28;
  pInput = (float *)((long)&gtest_ar.message_.ptr_ + 4);
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,pInput,1,"testKey1",0,0);
  gtest_ar.message_.ptr_._4_4_ = 0;
  local_30[1] = 0;
  local_30[0] = aiMaterial::Get((this->super_MaterialSystemTest).pcMat,"testKey1",0,0,pInput);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_28,"aiReturn_SUCCESS","pcMat->Get(\"testKey1\",0,0,pf)",
             local_30 + 1,local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_64 = 150392.62;
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_60,"150392.63f","pf",&local_64,
             (float *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testFloatProperty)
{
    float pf = 150392.63f;
    this->pcMat->AddProperty(&pf,1,"testKey1");
    pf = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey1",0,0,pf));
    EXPECT_EQ(150392.63f, pf);
}